

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::VariableDimensionSyntax*>::
emplace_back<slang::syntax::VariableDimensionSyntax*>
          (SmallVectorBase<slang::syntax::VariableDimensionSyntax*> *this,
          VariableDimensionSyntax **args)

{
  iterator ppVVar1;
  VariableDimensionSyntax **args_local;
  SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppVVar1 = SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *)this);
    this_local = (SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *)
                 emplaceRealloc<slang::syntax::VariableDimensionSyntax*>(this,ppVVar1,args);
  }
  else {
    ppVVar1 = SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *)this);
    *ppVVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *)
                 SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::back
                           ((SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }